

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::removeDoubletonEquations(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  bool bVar2;
  Result RVar3;
  pointer ppVar4;
  reference pvVar5;
  reference pvVar6;
  _Rb_tree_const_iterator<std::pair<int,_int>_> *in_RDI;
  Result __result;
  HighsInt eqrow;
  iterator eq;
  HighsInt in_stack_0000086c;
  HighsPostsolveStack *in_stack_00000870;
  HPresolve *in_stack_00000878;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar2 = std::operator!=(local_20,&local_28);
    if (!bVar2) {
      return kOk;
    }
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x6f7b41);
    iVar1 = ppVar4->second;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar1);
    if (2 < *pvVar5) break;
    RVar3 = rowPresolve(in_stack_00000878,in_stack_00000870,in_stack_0000086c);
    if (RVar3 != kOk) {
      return RVar3;
    }
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                        (long)iVar1);
    if (*pvVar6 == '\0') {
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++(in_RDI);
    }
    else {
      local_20[0]._M_node =
           (_Base_ptr)
           std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::begin(in_stack_ffffffffffffffb8);
    }
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeDoubletonEquations(
    HighsPostsolveStack& postsolve_stack) {
  auto eq = equations.begin();
  while (eq != equations.end()) {
    HighsInt eqrow = eq->second;
    assert(!rowDeleted[eqrow]);
    assert(eq->first == rowsize[eqrow]);
    assert(model->row_lower_[eqrow] == model->row_upper_[eqrow]);
    if (rowsize[eqrow] > 2) return Result::kOk;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, eqrow));
    if (rowDeleted[eqrow])
      eq = equations.begin();
    else
      ++eq;
  }

  return Result::kOk;
}